

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O2

int main(void)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  shared_ptr<SchemeInt> sVar5;
  string local_120;
  string local_100;
  undefined1 local_e0 [53];
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  undefined1 local_a8 [32];
  string local_88;
  undefined8 local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  undefined8 local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  undefined8 local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  undefined8 local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  if (scheme_true.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      scheme_false.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    iVar3 = (*(scheme_true.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_SchemeObject[6])
                      (scheme_true.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,&scheme_false);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(scheme_false.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_SchemeObject[6])
                        (scheme_false.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,&scheme_true);
      if ((char)iVar3 == '\0') {
        std::__cxx11::string::string((string *)&local_120,"#t",&local_a9);
        evaluate_string_in_global_context((string *)local_e0);
        if ((element_type *)local_e0._0_8_ ==
            scheme_true.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
          std::__cxx11::string::string((string *)&local_100,"#f",&local_aa);
          evaluate_string_in_global_context(&local_88);
          if ((element_type *)local_88._M_dataplus._M_p ==
              scheme_false.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
            local_88.field_2._12_4_ = 5;
            std::make_shared<SchemeInt,int>((int *)(local_a8 + 0x10));
            local_88.field_2._8_4_ = 6;
            sVar5 = std::make_shared<SchemeInt,int>((int *)&local_48);
            local_38 = local_48;
            _Stack_30._M_pi = _Stack_40._M_pi;
            local_48 = 0;
            _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            cVar1 = (**(code **)(*(long *)local_a8._16_8_ + 0x30))
                              (local_a8._16_8_,&local_38,
                               sVar5.super___shared_ptr<SchemeInt,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._M_pi);
            if (cVar1 == '\0') {
              std::__cxx11::string::string((string *)(local_e0 + 0x10),"8",&local_ab);
              evaluate_string_in_global_context((string *)local_a8);
              local_88.field_2._M_allocated_capacity._4_4_ = 8;
              sVar5 = std::make_shared<SchemeInt,int>((int *)&local_68);
              local_58 = local_68;
              _Stack_50._M_pi = _Stack_60._M_pi;
              local_68 = 0;
              _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              bVar2 = (**(code **)(*(long *)local_a8._0_8_ + 0x30))
                                (local_a8._0_8_,&local_58,
                                 sVar5.super___shared_ptr<SchemeInt,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi._M_pi);
              bVar2 = bVar2 ^ 1;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
              std::__cxx11::string::~string((string *)(local_e0 + 0x10));
            }
            else {
              bVar2 = 1;
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_30);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 0x18));
          }
          else {
            bVar2 = 1;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
          std::__cxx11::string::~string((string *)&local_100);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e0 + 8));
          std::__cxx11::string::~string((string *)&local_120);
          if (bVar2 == 0) {
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define x 1) (define (f x) (g 2)) (define (g y) (+ x y)) (f 5)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"3",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (list #t #f true false (if #t 1 2) (if #f 1 2) (if 0 1 2)) \'(#t #f #t #f 1 2 1))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? \'(8 . (13 . ())) (list 8 13))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"\n(define\tx 5 )(+\tx  2)  ",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"\n7\n",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"\'()\'()\"q\"`();",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"nil;t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define name \"max\")(equal? (list\"Hi\"name(+ 1 2)) \'(\"Hi\"\"max\"3))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define lambda) (define + 5) (define <=?) (define a-b) +",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"5",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(define fOO 5) Foo",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"5",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? #\\a #\\A)",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(define x ; 5 \n 6) x",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"6",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"((if #f = *) 3 4)",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"12",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"[+ 2 (+ 3 [+ 4 5])]",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"14",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(- 0 5)",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"-5",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string((string *)&local_120,"+5",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"5",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string((string *)&local_120,"+5.0",(allocator *)(local_e0 + 0x10))
            ;
            std::__cxx11::string::string((string *)&local_100,"5.0",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string((string *)&local_120,"+5/2",(allocator *)(local_e0 + 0x10))
            ;
            std::__cxx11::string::string((string *)&local_100,"2.5",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"((lambda (x) (+ x x)) 5)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"10",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define reverse-subtract (lambda (x y)(- y x)))(reverse-subtract 7 10)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"3",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define foo (let ((x 4)) (lambda (y) (+ x y)))) (foo 6)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"10",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define x (lambda x (cdr x))) (equal? (x 1 2 3) \'(2 3))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"((named-lambda (f x) (+ x x)) 4)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"8",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(let ((x 2) (y 3))(* x y))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"6",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(let ((x 2) (y 3))(let ((foo (lambda (z) (+ x y z)))(x 7))(foo 4)))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"9",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(let ((x 2) (y 3))(let* ((x 7)(z (+ x y)))(* z x))) ",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"70",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(letrec ((even?(lambda (n)(if (zero? n)#t(odd? (- n 1)))))(odd?(lambda (n)(if (zero? n)#f(even? (- n 1))))))(even? 88)) "
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define variable #t)(define (access-variable) variable)(let ((variable #f))(access-variable))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define variable #t)(define (access-variable) variable)(let ((variable #f))(access-variable)) variable"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define variable #t)(define (access-variable) variable)(fluid-let ((variable #f))(access-variable))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define variable #t)(define (access-variable) variable)(fluid-let ((variable #f))(access-variable)) variable"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(let ((x 5)) (define foo (lambda (y) (bar x y))) (define bar (lambda (a b) (+ (* a b) a))) (foo (+ x 3)))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"45",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(define x 2) (set! x 4) (+ x 1)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"5",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(define x 2) ((lambda () (set! x 4))) (+ x 1)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"5",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(define x 2) ((lambda () (define x 4))) (+ x 1)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"3",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (list (quote a) (quote #(a b c)) (quote (+ 1 2))) \'(a #(a b c) (+ 1 2)))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? \'\'a \'(quote a))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? `(list ,(+ 1 2) 4) \'(list 3 4))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (let ((name \'a)) `(list ,name \',name)) \'(list a \'a))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? `(a ,(+ 1 2) ,@(map abs \'(4 -5 6)) b) \'(a 3 4 5 6 b))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? `((foo ,(- 10 3)) ,@(cdr \'(c)) . ,(car \'(cons))) \'((foo 7) . cons))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? `(a `(b ,(+ 1 2) ,(foo ,(+ 1 3) d) e) f) \'(a `(b ,(+ 1 2) ,(foo 4 d) e) f))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (quasiquote (list (unquote (+ 1 2)) 4)) \'(list 3 4))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? \'(quasiquote (list (unquote (+ 1 2)) 4)) ``(list ,(+ 1 2) 4))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? \'(quasiquote (list (unquote (+ 1 2)) 4)) \'\'(list ,(+ 1 2) 4))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal?  (let ((name1 \'x)(name2 \'y)) `(a `(b ,,name1 ,\',name2 d) e)) \'(a `(b ,x ,\'y d) e))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"`,(+ 2 3)",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"5",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(if (> 3 2) \'yes \'no)",(allocator *)(local_e0 + 0x10)
                      );
            std::__cxx11::string::string((string *)&local_100,"\'yes",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(if (< 3 2) \'yes \'no)",(allocator *)(local_e0 + 0x10)
                      );
            std::__cxx11::string::string((string *)&local_100,"\'no",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(cond ((> 3 2) \'greater)((< 3 2) \'less))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"\'greater",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(cond ((> 3 3) \'greater)((< 3 3) \'less)(else \'equal))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"\'equal",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(cond (#f => car) ((cons 1 2) => cdr) (else #f))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"2",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(case (* 2 3)((2 3 5 7) \'prime)((1 4 6 8 9) \'composite))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"\'composite",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(case (car \'(c d))((a e i o u) \'vowel)((w y) \'semivowel)(else \'consonant))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"\'consonant",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (list (and (= 2 2) (> 2 1)) (and (= 2 2) (< 2 1)) (and 1 2 \'c \'(f g)) (and)) \'(#t #f (f g) #t))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (list (or (= 2 2) (> 2 1)) (or (= 2 2) (< 2 1)) (or #f #f #f) (or (memq \'b \'(a b c)) (/ 3 0))) \'(#t #t #f (b c)))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(define x 0) (begin (set! x 5)(+ x 1))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"6",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (let loop((numbers \'(3 -2 1 6 -5))(nonneg \'())(neg \'()))(cond ((null? numbers)(list nonneg neg))((>= (car numbers) 0)(loop (cdr numbers)(cons (car numbers) nonneg) neg)) (else(loop (cdr numbers) nonneg (cons (car numbers) neg))))) \'((6 1 3) (-5 -2)))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (do ((vec (make-vector 5))(i 0 (+ i 1)))((= i 5) vec)(vector-set! vec i i)) \'#(0 1 2 3 4))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(let ((x \'(1 3 5 7 9)))(do ((x x (cdr x))(sum 0 (+ sum (car x))))((null? x) sum)))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"25",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(let ([x 3]) (unless (= x 0) (set! x (+ x 1))) (when (= x 4) (set! x (* x 2))) x)"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"8",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(let ([x 3]) (when (= x 0) (set! x (+ x 1))) (unless (= x 3) (set! x (* x 2))) x)"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"3",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define (f x) (+ x x)) (define l \'(1 2 q)) (define p (cons car cdr)) (define v \'#(1 2 q)) (define s \"qwerty\") (define c (make-cell 5)) (define wp (weak-cons 42 37)) (and (eq? #t #t) (eq? #f #f) (eq? \'QWE \'Qwe) (eq? 7 7) (eq? 4.6 4.6) (eq? #\\o #\\o) (eq? cons cons) (eq? \'() \'()) (eq? f f) (eq? l l) (eq? p p) (eq? v v) (eq? s s) (eq? c c) (eq? wp wp))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(or (eq? \'(5 5) \'kek) (eq? #t #f) (eq? \'q \'w) (eq? 4 4.0) (eq? 4 5) (eq? 4.5 5.4) (eq? #\\A #\\B) (eq? \'() \'(())) (eq? (lambda x x) (lambda x 0)) (eq? (cons 1 1) (cons 1 1)) (eq? \'#() \'#()) (eq? \"qw\" \"qw\") (eq? (make-cell \'()) (make-cell \'())))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define gen-counter (lambda () (let ((n 0)) (lambda () (set! n (+ n 1)) n)))) (let ((g (gen-counter))) (eqv? g g))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define gen-counter (lambda () (let ((n 0)) (lambda () (set! n (+ n 1)) n)))) (eqv? (gen-counter) (gen-counter))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(and (equal? \'a \'a) (equal? \'(a) \'(a)) (equal? \'(a (b) \"c\") \'(a (b) \"c\")) (equal? (make-vector 5 \'a) (make-vector 5 \'a)))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(or (equal? \'a \'b) (equal? \'a \'(a)) (equal? \'(a (b) \"c\") \'((b) a \"c\")) (equal? (make-vector 5 \'a) (make-vector 6 \'a)) (equal? \"a\" \"A\"))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (list (number? 5) (number? 5.) (number? #\\5) (exact? 5) (exact? 5.) (inexact? 5) (inexact? 5.) (integer? 5) (integer? 5.) (integer? 5.5)) \'(#t #t #f #t #f #f #t #t #t #f))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (list (< 1 2) (<= 1 2) (> 1 2) (>= 1 2) (= 1 2) (< 2 1) (<= 2 1) (> 2 1) (>= 2 1) (= 2 1) (< 2 2.) (<= 2 2.) (> 2 2.) (>= 2 2.) (= 2 2.)) \'(#t #t #f #f #f #f #f #t #t #f #f #t #f #t #t))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (list (zero? 5) (positive? 5) (negative? 5) (zero? -5) (positive? -5) (negative? -5) (zero? 0)) \'(#f #t #f #f #f #t #t))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (list (+ 3 4 5) (+ 3 4) (+ 3) (+) (* 3 4 5) (* 3 4) (* 3) (*) (- 3 4 5) (- 3 4) (- 3) (/ 3 4)) \'(12 7 3 0 60 12 3 1 -6 -1 -3 0.75))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(1+ (-1+ 5))",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"5",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (list (abs 3) (abs -3) (quotient 13 4) (modulo 13 4) (remainder 13 4) (quotient -13 4) (modulo -13 4) (remainder -13 4) (quotient 13 -4) (modulo 13 -4) (remainder 13 -4)(quotient -13 -4) (modulo -13 -4) (remainder -13 -4)) \'(3 3 3 1 1 -3 3 -1 -3 -3 1 3 -1 -1))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(string->number \"13.5\")",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"13.5",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(string->number \"13\")",(allocator *)(local_e0 + 0x10)
                      );
            std::__cxx11::string::string((string *)&local_100,"13",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (number->string 13) \"13\")",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(rational? -2/3)",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string((string *)&local_120,"5/2",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"2.5",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            test_strings();
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define x (list \'a \'b \'c)) (define y x) (define r1 (list? y)) (set-cdr! x 4) (define r2 (list? y)) (set-cdr! x x) (define r3 (list? y)) (equal? (list r1 r2 r3) \'(#t #f #f))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(pair? \'())",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(pair? \'#(1 2))",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(pair? \'(1 2))",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(pair? \'(1 . 2))",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (car \'((a) b c d)) \'(a))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (cdr \'((a) b c d)) \'(b c d))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (vector->list \'#(dah dah didah)) \'(dah dah didah))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (string->list \"abcd\") \'(#\\a #\\b #\\c #\\d))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (substring->list \"abcdef\" 1 3) \'(#\\b #\\c))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(length \'(a (b) (c d e)))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"3",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(null? \'())",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(null? \'(()))",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(list-ref \'(a b c d) 2)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"\'c",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (sublist \'(a b c d e f) 1 4) \'(b c d))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (list-head \'(a b c d e f) 2) \'(a b))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define l \'(a b c d e f)) (eqv? (list-tail l 2) (cddr l))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (append \'(a (b)) \'((c))) \'(a (b) (c)))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(append)",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"nil",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (append \'(a b) \'(c . d)) \'(a b c . d))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(append \'() \'a)",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"\'a",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define x \'(a b c)) (define y \'(d e f)) (define z \'(g h)) (equal? (list (append! x y z) x y z)\'((a b c d e f g h) (a b c d e f g h) (d e f g h) (g h)))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (filter odd? \'(1 2 3 4 5)) \'(1 3 5))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (remove odd? \'(1 2 3 4 5)) \'(2 4))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (memq \'a \'(a b c)) \'(a b c))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (memq \'b \'(a b c)) \'(b c))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(memq \'d \'(a b c))",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(memq (list \'a) \'(b (a) c))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (member (list \'a) \'(b (a) c)) \'((a) c))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (memv 101 \'(100 101 102)) \'(101 102))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (map cadr \'((a b) (d e) (g h))) \'(b e h))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (map + \'(1 2 3) \'(4 5 6)) \'(5 7 9))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (let ((v (make-vector 5))) (for-each (lambda (i) (vector-set! v i (* i i))) \'(0 1 2 3 4))v) \'#(0 1 4 9 16))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(reduce-left + 0 \'(1 2 3 4))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"10",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(reduce-left + 0 \'(foo))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"\'foo",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(reduce-left + 0 \'())",(allocator *)(local_e0 + 0x10))
            ;
            std::__cxx11::string::string((string *)&local_100,"0",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (reduce-left list \'() \'(1 2 3 4)) \'(((1 2) 3) 4))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (reduce-right list \'() \'(1 2 3 4)) \'(1 (2 (3 4))))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (fold-right list \'() \'(1 2 3 4)) \'(1 (2 (3 (4 ())))))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (fold-left list \'() \'(1 2 3 4)) \'((((() 1) 2) 3) 4))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(any integer? \'(a 3 b 2.7))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(every integer? \'(a 3 b 2.7))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(any integer? \'(a 3.1 b 2.7))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(every integer? \'(1 2 3. 4))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(any < \'(3 1 4 1 5) \'(2 7 1 8 2))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(every < \'(3 1 4 1 5) \'(2 7 1 8 2))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (reverse \'(a (b c) d (e (f)))) \'((e (f)) d (b c) a))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (make-vector 5 \'a) \'#(a a a a a))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (vector 5 \'a) \'#(5 a))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define a (list->vector \'(1 2 3))) (define b a) (define c (vector-copy a)) (vector-set! a 0 0) (equal? (list (eq? a b) (eq? a c) (vector-ref b 0) (vector-ref c 0) (vector-length b)) \'(#t #f 0 1 3))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (make-initialized-vector 5 (lambda (x) (* x x))) \'#(0 1 4 9 16))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(vector-length (vector-grow \'#(1 2 3) 5))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"5",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (vector-map cadr \'#((a b) (d e) (g h))) \'#(b e h))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(vector-ref \'#(1 1 2 3 5 8 13 21) 5)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"8",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (let ((vec (vector 0 \'(2 2 2 2) \"Anna\"))) (vector-set! vec 1 \'(\"Sue\" \"Sue\")) vec) \'#(0 (\"Sue\" \"Sue\") \"Anna\"))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (subvector \'#(0 1 2 3 4 5) 2 4) \'#(2 3))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (vector-head \'#(0 1 2 3 4 5) 2) \'#(0 1))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (vector-tail \'#(0 1 2 3 4 5) 2) \'#(2 3 4 5))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define v \'#(0 1 2 3 4)) (subvector-fill! v 1 3 \'q) (equal? v \'#(0 q q 3 4))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(not 5)",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(not #f)",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(boolean/and #f #t #t)",(allocator *)(local_e0 + 0x10))
            ;
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(boolean/and \'f #t #t)",(allocator *)(local_e0 + 0x10)
                      );
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(boolean/or #f)",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(boolean/or #f #t #t)",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(symbol? \'car)",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(symbol? \"car\")",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(symbol? (string->uninterned-symbol \"car\"))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? \"Kek\" (symbol->string (string->symbol \"Kek\")))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? \'Kek (string->symbol \"Kek\"))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? \'Kek (intern \"Kek\"))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"\'Kek",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"\'kek",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(eq? (string->uninterned-symbol \"car\") (string->uninterned-symbol \"car\"))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(symbol-append \'foo- \'bar)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"\'foo-bar",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(symbol-append \'foo- (string->uninterned-symbol \"baz\"))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"\'foo-baz",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(symbol-append \'foo- (string->symbol \"BAZ\"))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string
                      ((string *)&local_100,"(string->symbol \"foo-BAZ\")",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(symbol<? \'a \'b)",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(symbol<? \'B \'a)",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(cell? (make-cell make-cell))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(cell-contents (make-cell 42))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"42",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define c (make-cell 42)) (set-cell-contents! c 37) (cell-contents c)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"37",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(force (delay (+ 1 2)))",(allocator *)(local_e0 + 0x10)
                      );
            std::__cxx11::string::string((string *)&local_100,"3",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (let ((p (delay (+ 1 2)))) (list (force p) (force p))) \'(3 3))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(define p (delay 5)) (promise-forced? p)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(define p (delay 5)) (force p) (promise-forced? p)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(define p (delay 5)) (force p) (promise-value p)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"5",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define count 0) (define p (delay (begin (set! count (+ count 1)) (* x 3)))) (define x 5) (force p) (force p) count"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"1",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(define p (weak-cons 37 42)) (weak-pair/car? p)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define a 37) (define p (weak-cons a 42)) (weak-pair/car? p)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(define a 37) (define p (weak-cons a 42)) (weak-car p)"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"37",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define a 37) (define p (weak-cons a 42)) (define a) (weak-pair/car? p)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define a 37) (define p (weak-cons a 42)) (define a) (weak-car p)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define p (weak-cons 37 42)) (weak-set-car! p car) (weak-car p)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"car",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(define p (weak-cons 37 42)) (weak-cdr p)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"42",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define p (weak-cons 37 42)) (weak-set-cdr! p 337) (weak-cdr p)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"337",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(apply + 3 4 \'(5 6))",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"18",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(procedure? car)",(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(primitive-procedure? car)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(compound-procedure? car)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(procedure? (lambda x x))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(primitive-procedure? (lambda x x))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(compound-procedure? (lambda x x))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (procedure-arity (lambda () 3)) \'(0 . 0))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (procedure-arity (lambda (x) 3)) \'(1 . 1))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (procedure-arity car) \'(1 . 1))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (procedure-arity /) \'(1 . #f))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (procedure-arity (lambda (x #!optional y) x)) \'(1 . 2))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (procedure-arity (lambda (x #!optional y q #!rest z) x)) \'(1 . #f))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (procedure-arity make-vector) \'(1 . 2))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"((make-primitive-procedure \'car) \'(1 2))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"1",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(primitive-procedure-name car)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"\'car",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define (f x #!optional y) (cons x y)) (equal? (f 1 2) \'(1 . 2))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define (f x #!optional y) (cons x y)) (default-object? (cdr (f 1 2)))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define (f x #!optional y) (cons x y)) (default-object? (cdr (f 1)))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(environment? (the-environment))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(environment-has-parent? (the-environment))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(environment-has-parent? (environment-parent (the-environment)))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define x) (equal? (environment-bound-names (the-environment)) \'(x))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define x) (define y 5) (equal? (environment-bindings (the-environment)) \'((x) (y 5)))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(environment-reference-type (the-environment) \'map)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"\'normal",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(environment-reference-type (the-environment) \'kek)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"\'unbound",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(environment-reference-type (the-environment) \'define)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"\'macro",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define define) (environment-reference-type (the-environment) \'define)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"\'unassigned",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define define) (environment-reference-type (environment-parent (the-environment)) \'define)"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"\'macro",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define define) (environment-bound? (the-environment) \'define)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define define) (environment-assigned? (the-environment) \'define)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define x 5) (environment-lookup (the-environment) \'x)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"5",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define x 5) (environment-assign! (the-environment) \'x 6) x",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"6",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(environment-define (the-environment) \'x 6) x",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"6",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(define x 5) (eval \'(+ x x) (the-environment))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"10",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(environment-has-parent? user-initial-environment)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(environment-has-parent? system-global-environment)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define x 5) (environment-lookup (nearest-repl/environment) \'x)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"5",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define map 5) (ge system-global-environment) (procedure? map)",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define map 5) (ge system-global-environment) (ge user-initial-environment) (procedure? map)"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#f",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define env (make-root-top-level-environment \'(x) \'(5))) (ge env) x",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"5",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define env (make-top-level-environment \'(x) \'(5))) (ge env) (procedure? map)"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define env (make-top-level-environment \'(x) \'(5))) (ge env) x",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"5",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(and (port? console-i/o-port) (i/o-port? console-i/o-port) (input-port? (current-input-port)) (output-port? (current-output-port)))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define s (open-input-string \"qwe\\nrty\\nuio\")) (close-all-open-files) (read-line s) (equal? (read-line s) \"rty\")"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define s (open-output-string)) (close-all-open-files) (display \'qwe s) (newline s) (equal? (get-output-string s) \"qwe\\n\")"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (with-input-from-string \"(a b c) (d e f)\" read) \'(a b c))",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (call-with-output-string (lambda (p) (display 42 p))) \"42\")",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(define i (open-input-string \"qwe rty\")) (define o (open-output-string)) (set-current-input-port! i) (set-current-output-port! o) (write (read-char)) (equal? (get-output-string o) \"#\\\\q\")"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (with-output-to-string (lambda () (write \'abc))) \"abc\")",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (write-to-string \"1 2 3\") \"\\\"1 2 3\\\"\")"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,"(equal? (write-to-string \'\'(a b c)) \"\'(a b c)\")",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (write-to-string \'(quote . 1)) \"(quote . 1)\")",
                       (allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::string
                      ((string *)&local_120,
                       "(equal? (with-input-from-string \"qw\" (lambda () (list (peek-char) (read-char) (read-char) (peek-char) (read-char)))) \'(#\\q #\\q #\\w eof eof))"
                       ,(allocator *)(local_e0 + 0x10));
            std::__cxx11::string::string((string *)&local_100,"#t",(allocator *)local_e0);
            run_test(&local_120,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
            return 0;
          }
        }
        else {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e0 + 8));
          std::__cxx11::string::~string((string *)&local_120);
        }
      }
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Something weird happened");
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(1);
}

Assistant:

int main()
{
    if(scheme_true == scheme_false || scheme_true->is_eq(scheme_false) || scheme_false->is_eq(scheme_true) ||
       evaluate_string_in_global_context("#t") != scheme_true ||
       evaluate_string_in_global_context("#f") != scheme_false ||
       std::make_shared<SchemeInt>(5)->is_eq(std::make_shared<SchemeInt>(6)) ||
       !evaluate_string_in_global_context("8")->is_eq(std::make_shared<SchemeInt>(8)))
    {
        std::cout << "Something weird happened" << std::endl;
        exit(1);
    }
    test_basic();
    test_special_forms();
    test_equality();
    test_math();
    test_strings();
    test_lists();
    test_vectors();
    test_misc();
    test_procedures();
    test_io();
}